

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O1

int __thiscall sqlite::Connection::Stmt::bind(Stmt *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  sqlite3_stmt *psVar1;
  int iVar2;
  Logic_error *this_00;
  long *plVar3;
  char *pcVar4;
  long *plVar5;
  size_type *psVar6;
  undefined4 in_register_00000034;
  undefined4 in_XMM0_Da;
  allocator local_b9;
  undefined4 local_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar1 = this->stmt_;
  local_b8 = in_XMM0_Da;
  iVar2 = bind_parameter_index(this,(string *)CONCAT44(in_register_00000034,__fd));
  iVar2 = sqlite3_bind_double(local_b8,psVar1,iVar2);
  if (iVar2 == 0) {
    return iVar2;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  std::operator+(&local_50,"Error binding ",(string *)CONCAT44(in_register_00000034,__fd));
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_b0 == plVar5) {
    local_a0 = *plVar5;
    uStack_98 = (undefined4)plVar3[3];
    uStack_94 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  sqlite3_errmsg(this->db_);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_90._M_dataplus._M_p = (pointer)*plVar3;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_90._M_dataplus._M_p == psVar6) {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90.field_2._8_4_ = (undefined4)plVar3[3];
    local_90.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar6;
  }
  local_90._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pcVar4 = (char *)sqlite3_sql(this->stmt_);
  std::__cxx11::string::string((string *)&local_70,pcVar4,&local_b9);
  Logic_error::Logic_error(this_00,&local_90,&local_70,iVar2,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

void Connection::Stmt::bind(const std::string & name, const double val)
    {
        int status = sqlite3_bind_double(stmt_, bind_parameter_index(name), val);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding " + name +
                ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }